

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

uint32_t __thiscall spvtools::opt::Pass::TakeNextId(Pass *this)

{
  uint32_t uVar1;
  
  uVar1 = IRContext::TakeNextId(this->context_);
  return uVar1;
}

Assistant:

uint32_t TakeNextId() { return context_->TakeNextId(); }